

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void monty_export_into(MontyContext *mc,mp_int *r,mp_int *x)

{
  mp_int reduced;
  mp_int local_20;
  
  if (x->nw <= mc->rw * 2) {
    local_20 = monty_reduce_internal(mc,x,*mc->scratch);
    mp_copy_into(r,&local_20);
    mp_clear(mc->scratch);
    return;
  }
  __assert_fail("x->nw <= 2*mc->rw",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/mpint.c",
                0x601,"void monty_export_into(MontyContext *, mp_int *, mp_int *)");
}

Assistant:

void monty_export_into(MontyContext *mc, mp_int *r, mp_int *x)
{
    assert(x->nw <= 2*mc->rw);
    mp_int reduced = monty_reduce_internal(mc, x, *mc->scratch);
    mp_copy_into(r, &reduced);
    mp_clear(mc->scratch);
}